

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::GenerateRandomData
          (AESStateMBEDTLS *this,data_ptr_t data,idx_t len)

{
  long lVar1;
  size_t __n;
  uint32_t random_integer;
  RandomEngine random_engine;
  
  lVar1 = duckdb::Timestamp::GetCurrentTimestamp();
  duckdb::RandomEngine::RandomEngine(&random_engine,lVar1);
  for (; len != 0; len = len - __n) {
    random_integer = duckdb::RandomEngine::NextRandomInteger();
    __n = 4;
    if (len < 4) {
      __n = len;
    }
    switchD_0036ec8a::default(data,&random_integer,__n);
    data = data + __n;
  }
  duckdb::RandomEngine::~RandomEngine(&random_engine);
  return;
}

Assistant:

void MbedTlsWrapper::AESStateMBEDTLS::GenerateRandomData(duckdb::data_ptr_t data, duckdb::idx_t len) {
	duckdb::RandomEngine random_engine(duckdb::Timestamp::GetCurrentTimestamp().value);
	while (len != 0) {
		const auto random_integer = random_engine.NextRandomInteger();
		const auto next = duckdb::MinValue<duckdb::idx_t>(len, sizeof(random_integer));
		memcpy(data, duckdb::const_data_ptr_cast(&random_integer), next);
		data += next;
		len -= next;
	}
}